

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::AtomEscapePass0
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  StandardChars<unsigned_char> *pSVar1;
  EncodedChar *pEVar2;
  code *pcVar3;
  EncodedChar EVar4;
  bool bVar5;
  Char CVar6;
  CharCount n;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong in_RAX;
  undefined4 *puVar11;
  ArenaAllocator *pAVar12;
  undefined8 uStack_38;
  Char c;
  bool surrogateEncountered;
  
  uStack_38 = in_RAX;
  EVar4 = ECLookahead(this,0);
  if ((EVar4 == '\0') && (this->inputLim <= this->next)) {
    Fail(this,-0x7ff5ec67);
    return false;
  }
  bVar5 = StandardChars<unsigned_char>::IsDigit(this->standardEncodedChars,EVar4);
  if (bVar5) {
    do {
      ECConsume(this,1);
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,0);
      bVar5 = StandardChars<unsigned_char>::IsDigit(pSVar1,EVar4);
    } while (bVar5);
    return false;
  }
  EVar4 = ECLookahead(this,0);
  if (EVar4 == 'c') {
    pSVar1 = this->standardEncodedChars;
    EVar4 = ECLookahead(this,1);
    bVar5 = StandardChars<unsigned_char>::IsLetter(pSVar1,EVar4);
    if (!bVar5) {
      DeferredFailIfUnicode(this,-0x7ff5e9d6);
      return false;
    }
  }
  else {
    pEVar2 = this->next;
    CVar6 = NextChar(this);
    uStack_38._0_6_ = CONCAT24(CVar6,(undefined4)uStack_38);
    if (CVar6 == L'B') {
      return true;
    }
    if (CVar6 == L'b') {
      return true;
    }
    if (CVar6 == L'u') {
      uStack_38 = uStack_38 & 0xffffffffffffff;
      n = TryParseExtendedUnicodeEscape
                    (this,(Char *)((long)&uStack_38 + 4),(bool *)((long)&uStack_38 + 7),true);
      if ((int)n < 1) {
        if (this->inputLim < this->next + 4) {
          return false;
        }
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,0);
        bVar5 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
        if (!bVar5) {
          return false;
        }
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,1);
        bVar5 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
        if (!bVar5) {
          return false;
        }
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,2);
        bVar5 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
        if (!bVar5) {
          return false;
        }
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,3);
        bVar5 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
        if (!bVar5) {
          return false;
        }
        n = 4;
        if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
          pSVar1 = this->standardEncodedChars;
          EVar4 = ECLookahead(this,0);
          uVar7 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
          pSVar1 = this->standardEncodedChars;
          EVar4 = ECLookahead(this,1);
          uVar8 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
          pSVar1 = this->standardEncodedChars;
          EVar4 = ECLookahead(this,2);
          uVar9 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
          pSVar1 = this->standardEncodedChars;
          EVar4 = ECLookahead(this,3);
          uVar10 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
          TrackIfSurrogatePair
                    (this,uVar9 << 4 | uVar10 | uVar7 << 0xc | uVar8 << 8,this->next + -1,5);
        }
      }
      else {
        if (uStack_38._7_1_ != '\x01') {
          return false;
        }
        pAVar12 = this->ctAllocator;
        if ((pAVar12 != (ArenaAllocator *)0x0) &&
           (this->currentSurrogatePairNode == (SurrogatePairTracker *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x620,
                             "(this->ctAllocator == nullptr || this->currentSurrogatePairNode != nullptr)"
                             ,
                             "this->ctAllocator == nullptr || this->currentSurrogatePairNode != nullptr"
                            );
          if (!bVar5) goto LAB_00d2dbd4;
          *puVar11 = 0;
          pAVar12 = this->ctAllocator;
        }
        if ((pAVar12 != (ArenaAllocator *)0x0) &&
           (pEVar2 != this->currentSurrogatePairNode->location)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x621,
                             "(this->ctAllocator == nullptr || current == this->currentSurrogatePairNode->location)"
                             ,
                             "this->ctAllocator == nullptr || current == this->currentSurrogatePairNode->location"
                            );
          if (!bVar5) {
LAB_00d2dbd4:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar11 = 0;
        }
      }
      goto LAB_00d2d8d2;
    }
    if (CVar6 != L'x') {
      return false;
    }
    if (this->inputLim < this->next + 2) {
      return false;
    }
    pSVar1 = this->standardEncodedChars;
    EVar4 = ECLookahead(this,0);
    bVar5 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
    if (!bVar5) {
      return false;
    }
    pSVar1 = this->standardEncodedChars;
    EVar4 = ECLookahead(this,1);
    bVar5 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
    if (!bVar5) {
      return false;
    }
  }
  n = 2;
LAB_00d2d8d2:
  ECConsume(this,n);
  return false;
}

Assistant:

bool Parser<P, IsLiteral>::AtomEscapePass0()
    {
        EncodedChar ec = ECLookahead();
        if (ec == 0 && IsEOF())
        {
            // Terminating 0
            Fail(JSERR_RegExpSyntax);
            return false;
        }
        else if (standardEncodedChars->IsDigit(ec))
        {
            do
            {
                ECConsume();
            }
            while (standardEncodedChars->IsDigit(ECLookahead())); // terminating 0 is not a digit
            return false;
        }
        else if (ECLookahead() == 'c')
        {
            if (standardEncodedChars->IsLetter(ECLookahead(1))) // terminating 0 is not a letter
            {
                ECConsume(2);
            }
            else
            {
                DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
            }
            return false;
        }
        else
        {
            const EncodedChar *current = next;
            // An escaped '/' is ok
            Char c = NextChar();
            switch (c)
            {
            case 'b':
            case 'B':
                return true;
            // case 'c': handled as special case above
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                    ECConsume(2);
                break;
            case 'u':
                bool surrogateEncountered = false;
                int lengthOfSurrogate = TryParseExtendedUnicodeEscape(c, surrogateEncountered, true);
                if (lengthOfSurrogate > 0)
                {
                    if (surrogateEncountered)
                    {
                        // If we don't have an allocator, we don't create nodes
                        // Asserts in place as extra checks for when we do have an allocator
                        Assert(this->ctAllocator == nullptr || this->currentSurrogatePairNode != nullptr);
                        Assert(this->ctAllocator == nullptr || current == this->currentSurrogatePairNode->location);
                        ECConsume(lengthOfSurrogate);
                    }
                    //Don't fall through
                    break;
                }
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    if (this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                    {
                        codepoint_t value = (standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                                            (standardEncodedChars->DigitValue(ECLookahead(3)));
                        TrackIfSurrogatePair(value, (next - 1), 5);
                    }
                    ECConsume(4);
                }
                break;
            }
            // embedded 0 is ok

            return false;
        }
    }